

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrqfa.cc
# Opt level: O0

void predict_or_learn<false>(LRQFAstate *lrq,single_learner *base,example *ec)

{
  bool bVar1;
  uchar **ppuVar2;
  size_t sVar3;
  float *pfVar4;
  unsigned_long *puVar5;
  ostream *__x;
  ostream *__y;
  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *this;
  element_type *peVar6;
  ostream *poVar7;
  char *__s;
  byte *pbVar8;
  v_array<float> *this_00;
  float **ppfVar9;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar10;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  **ppsVar11;
  v_array<unsigned_char> *in_RDX;
  long *in_RDI;
  __type_conflict _Var12;
  size_t j;
  features *rfs_1;
  namespace_index right_1;
  char i_1;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  char *new_feature;
  char *new_space;
  stringstream new_feature_buffer;
  uint64_t rwindex;
  uint64_t rindex;
  float rfx;
  features *rfs;
  uint rfn;
  float *lw;
  uint64_t lwindex;
  uint n;
  uint64_t lindex;
  float lfx;
  features *fs;
  uint lfn;
  uint rfd_id;
  uint lfd_id;
  uchar right;
  uchar left;
  const_iterator i2;
  const_iterator i1;
  uint iter;
  uint64_t weight_mask;
  uint32_t stride_shift;
  float sqrtk;
  uint k;
  uint maxiter;
  float first_loss;
  float first_prediction;
  size_t which;
  namespace_index i;
  uchar *__end1;
  uchar *__begin1;
  v_array<unsigned_char> *__range1;
  vw *all;
  parameters *in_stack_fffffffffffffc98;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffca0;
  example *in_stack_fffffffffffffca8;
  features *in_stack_fffffffffffffcb0;
  undefined6 in_stack_fffffffffffffcf0;
  byte bVar13;
  byte bVar14;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_308;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e8;
  long *local_2e0;
  undefined1 local_2c8 [80];
  ostream local_278;
  long local_100;
  unsigned_long local_f8;
  float local_ec;
  v_array<float> *local_e8;
  uint local_dc;
  weight *local_d8;
  long local_d0;
  uint local_c4;
  unsigned_long local_c0;
  float local_b4;
  v_array<float> *local_b0;
  uint local_a8;
  int local_a4;
  int local_a0;
  byte local_9a;
  byte local_99;
  undefined8 local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined8 local_88;
  undefined8 local_80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  uint local_6c;
  uint64_t local_68;
  uint32_t local_60;
  float local_5c;
  uint local_58;
  uint local_54;
  undefined4 local_50;
  undefined4 local_4c;
  ulong local_48;
  byte local_39;
  byte *local_38;
  byte *local_30;
  v_array<unsigned_char> *local_28;
  long local_20;
  v_array<unsigned_char> *local_18;
  long *local_8;
  
  local_20 = *in_RDI;
  local_18 = in_RDX;
  local_8 = in_RDI;
  memset(in_RDI + 0x86,0,0x800);
  local_28 = local_18;
  ppuVar2 = v_array<unsigned_char>::begin(local_18);
  local_30 = *ppuVar2;
  ppuVar2 = v_array<unsigned_char>::end(local_28);
  local_38 = *ppuVar2;
  for (; local_30 != local_38; local_30 = local_30 + 1) {
    local_39 = *local_30;
    sVar3 = features::size((features *)0x2da9f0);
    local_8[(ulong)local_39 + 0x86] = sVar3;
  }
  local_48 = local_18[0x344].erase_count;
  local_4c = 0;
  local_50 = 0;
  local_54 = 1;
  local_58 = *(uint *)(local_8 + 5);
  _Var12 = std::sqrt<unsigned_int>(0);
  local_5c = (float)_Var12;
  local_60 = parameters::stride_shift(in_stack_fffffffffffffc98);
  local_68 = parameters::mask(in_stack_fffffffffffffc98);
  for (local_6c = 0; local_6c < local_54; local_6c = local_6c + 1) {
    local_80 = std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffca0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffc98);
    while( true ) {
      local_88 = std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffca0,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc98);
      if (!bVar1) break;
      local_90 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffca8,(difference_type)in_stack_fffffffffffffca0
                            );
      while( true ) {
        local_98 = std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffca0,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffc98);
        if (!bVar1) break;
        if ((local_48 & 1) == 0) {
          pbVar8 = (byte *)__gnu_cxx::
                           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_90);
          bVar14 = *pbVar8;
        }
        else {
          pbVar8 = (byte *)__gnu_cxx::
                           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_78);
          bVar14 = *pbVar8;
        }
        local_99 = bVar14;
        if ((local_48 + 1 & 1) == 0) {
          pbVar8 = (byte *)__gnu_cxx::
                           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_90);
          bVar13 = *pbVar8;
        }
        else {
          pbVar8 = (byte *)__gnu_cxx::
                           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_78);
          bVar13 = *pbVar8;
        }
        local_a0 = *(int *)((long)local_8 + (ulong)local_99 * 4 + 0x2c);
        local_a4 = *(int *)((long)local_8 + (ulong)bVar13 * 4 + 0x2c);
        local_9a = bVar13;
        for (local_a8 = 0; (ulong)local_a8 < (ulong)local_8[(ulong)local_99 + 0x86];
            local_a8 = local_a8 + 1) {
          local_b0 = (v_array<float> *)((long)local_18 + (ulong)local_99 * 0x68 + 0x20);
          pfVar4 = v_array<float>::operator[](local_b0,(ulong)local_a8);
          local_b4 = *pfVar4;
          puVar5 = v_array<unsigned_long>::operator[]
                             ((v_array<unsigned_long> *)(local_b0 + 1),(ulong)local_a8);
          local_c0 = *puVar5;
          for (local_c4 = 1; local_c4 <= local_58; local_c4 = local_c4 + 1) {
            local_d0 = local_c0 +
                       ((ulong)(local_a4 * local_58 + local_c4) << ((byte)local_60 & 0x3f));
            local_d8 = parameters::operator[]
                                 ((parameters *)in_stack_fffffffffffffca8,
                                  (size_t)in_stack_fffffffffffffca0);
            for (local_dc = 0; (ulong)local_dc < (ulong)local_8[(ulong)local_9a + 0x86];
                local_dc = local_dc + 1) {
              local_e8 = (v_array<float> *)((long)local_18 + (ulong)local_9a * 0x68 + 0x20);
              pfVar4 = v_array<float>::operator[](local_e8,(ulong)local_dc);
              local_ec = *pfVar4;
              puVar5 = v_array<unsigned_long>::operator[]
                                 ((v_array<unsigned_long> *)(local_e8 + 1),(ulong)local_dc);
              local_f8 = *puVar5;
              local_100 = local_f8 +
                          ((ulong)(local_a0 * local_58 + local_c4) << ((byte)local_60 & 0x3f));
              features::push_back(in_stack_fffffffffffffcb0,
                                  (feature_value)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                                  (feature_index)in_stack_fffffffffffffca0);
              if (((*(byte *)(local_20 + 0x3438) & 1) != 0) ||
                 ((*(byte *)(local_20 + 0x3618) & 1) != 0)) {
                std::__cxx11::stringstream::stringstream((stringstream *)(local_2c8 + 0x40));
                __x = std::operator<<(&local_278,local_9a);
                __y = std::operator<<(__x,'^');
                this = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)(local_e8 + 2),(ulong)local_dc)->
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ;
                peVar6 = std::
                         __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ::get(this);
                poVar7 = std::operator<<(__y,(string *)&peVar6->second);
                poVar7 = std::operator<<(poVar7,'^');
                std::ostream::operator<<(poVar7,local_c4);
                local_2c8._40_8_ = strdup("lrqfa");
                std::__cxx11::stringstream::str();
                in_stack_fffffffffffffcb0 = (features *)local_2c8;
                __s = (char *)std::__cxx11::string::c_str();
                puVar5 = (unsigned_long *)strdup(__s);
                std::__cxx11::string::~string((string *)in_stack_fffffffffffffcb0);
                local_2c8._32_8_ = puVar5;
                operator_new(0x40);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<char_*&,_char_*&,_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(bVar14,CONCAT16(bVar13,in_stack_fffffffffffffcf0)),
                           (char **)__x,(char **)__y);
                std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
                shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                          ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffca0,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffc98);
                v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back(in_stack_fffffffffffffca0,
                            (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffc98);
                std::
                shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x2db020);
                std::__cxx11::stringstream::~stringstream((stringstream *)(local_2c8 + 0x40));
              }
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_90);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_78);
    }
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
               (size_t)in_stack_fffffffffffffca0);
    if (local_6c == 0) {
      local_4c = *(undefined4 *)&local_18[0x342].end_array;
      local_50 = *(undefined4 *)&local_18[0x345].end_array;
    }
    else {
      *(undefined4 *)&local_18[0x342].end_array = local_4c;
      *(undefined4 *)&local_18[0x345].end_array = local_50;
    }
    local_2e0 = local_8 + 1;
    local_2e8._M_current = (char *)std::__cxx11::string::begin();
    std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffca0,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc98);
      if (!bVar1) break;
      pbVar8 = (byte *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_2e8);
      bVar14 = *pbVar8;
      this_00 = (v_array<float> *)((long)local_18 + (ulong)bVar14 * 0x68 + 0x20);
      ppfVar9 = v_array<float>::begin(this_00);
      in_stack_fffffffffffffca8 = (example *)(*ppfVar9 + local_8[(ulong)bVar14 + 0x86]);
      ppfVar9 = v_array<float>::end(this_00);
      *ppfVar9 = (float *)in_stack_fffffffffffffca8;
      if (((*(byte *)(local_20 + 0x3438) & 1) != 0) || ((*(byte *)(local_20 + 0x3618) & 1) != 0)) {
        local_308 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_8[(ulong)bVar14 + 0x86];
        while( true ) {
          in_stack_fffffffffffffca0 = local_308;
          pvVar10 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::size((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)(this_00 + 2));
          if (pvVar10 <= in_stack_fffffffffffffca0) break;
          v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this_00 + 2),(size_t)local_308);
          std::
          shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x2db2df);
          local_308 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)((long)&((__shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                   *)&local_308->_begin)->_M_ptr + 1);
        }
        ppsVar11 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)(this_00 + 2));
        in_stack_fffffffffffffc98 = (parameters *)(*ppsVar11 + local_8[(ulong)bVar14 + 0x86]);
        ppsVar11 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(this_00 + 2));
        *ppsVar11 = (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc98;
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_2e8);
    }
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

void predict_or_learn(LRQFAstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices) lrq.orig_size[i] = ec.feature_space[i].size();

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;
  unsigned int k = lrq.k;
  float sqrtk = (float)sqrt(k);

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  uint64_t weight_mask = lrq.all->weights.mask();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa

    for (string::const_iterator i1 = lrq.field_name.begin(); i1 != lrq.field_name.end(); ++i1)
    {
      for (string::const_iterator i2 = i1 + 1; i2 != lrq.field_name.end(); ++i2)
      {
        unsigned char left = (which % 2) ? *i1 : *i2;
        unsigned char right = ((which + 1) % 2) ? *i1 : *i2;
        unsigned int lfd_id = lrq.field_id[left];
        unsigned int rfd_id = lrq.field_id[right];
        for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
        {
          features& fs = ec.feature_space[left];
          float lfx = fs.values[lfn];
          uint64_t lindex = fs.indicies[lfn];
          for (unsigned int n = 1; n <= k; ++n)
          {
            uint64_t lwindex =
                (lindex + ((uint64_t)(rfd_id * k + n) << stride_shift));  // a feature has k weights in each field
            float* lw = &all.weights[lwindex & weight_mask];
            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex) * 0.5f / sqrtk;

            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              features& rfs = ec.feature_space[right];
              //                    feature* rf = ec.atomics[right].begin + rfn;
              // NB: ec.ft_offset added by base learner
              float rfx = rfs.values[rfn];
              uint64_t rindex = rfs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)(lfd_id * k + n) << stride_shift));

              rfs.push_back(*lw * lfx * rfx, rwindex);
              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << rfs.space_names[rfn].get()->second << '^' << n;
#ifdef _WIN32
                char* new_space = _strdup("lrqfa");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrqfa");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                rfs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
    }

    for (char i : lrq.field_name)
    {
      namespace_index right = i;
      features& rfs = ec.feature_space[right];
      rfs.values.end() = rfs.values.begin() + lrq.orig_size[right];

      if (all.audit || all.hash_inv)
      {
        for (size_t j = lrq.orig_size[right]; j < rfs.space_names.size(); ++j) rfs.space_names[j].~audit_strings_ptr();

        rfs.space_names.end() = rfs.space_names.begin() + lrq.orig_size[right];
      }
    }
  }
}